

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

void Dar_ManRefStop(Ref_Man_t *p)

{
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *__ptr_01;
  int *__ptr_02;
  int iVar3;
  long lVar4;
  
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pPars->fVerbose != 0) {
    Dar_ManRefPrintStats(p);
  }
  __ptr = p->vCuts;
  iVar3 = __ptr->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      __ptr_00 = __ptr->pArray[lVar4];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
        iVar3 = __ptr->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pVVar1 = p->vTruthElem;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTruthStore;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vLeavesBest;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr_01 = p->vMemory;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (int *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  pVVar1 = p->vCutNodes;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Dar_ManRefStop( Ref_Man_t * p )
{
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pPars->fVerbose )
        Dar_ManRefPrintStats( p );
    Vec_VecFree( p->vCuts );
    Vec_PtrFree( p->vTruthElem );
    Vec_PtrFree( p->vTruthStore );
    Vec_PtrFree( p->vLeavesBest );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vCutNodes );
    ABC_FREE( p );
}